

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

Raster * rw::ps2::rasterCreate(Raster *raster)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int32 iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long *plVar20;
  Raster *pRVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  undefined1 *puVar26;
  ulong uVar27;
  undefined8 *puVar28;
  uint8 *puVar29;
  bool bVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  long *plVar38;
  byte bVar39;
  int iVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  ulong uVar48;
  int iVar49;
  ulong uVar50;
  uint uVar51;
  long lVar52;
  long lVar53;
  uint uVar54;
  int iVar55;
  long lVar56;
  int iVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  uint64 bufferBase [7];
  uint32 bufferPage_B [8];
  uint64 bufferWidth [7];
  uint32 bufferHeight_P [8];
  uint32 heightstack_Px [8];
  uint32 widthstack_Px [8];
  ulong local_290;
  ulong local_288;
  ulong local_280;
  ulong local_260;
  ulong local_250;
  ulong local_248;
  int local_238;
  ulong local_208;
  ulong local_1e8;
  ulong local_1e0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  ulong local_198;
  ulong local_188;
  undefined8 local_180;
  long local_178;
  int local_170;
  uint local_16c;
  int local_168 [6];
  ulong auStack_150 [10];
  undefined8 local_100;
  int local_f8 [8];
  uint auStack_d8 [8];
  ulong local_b8;
  uint8 **local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_98 [8];
  uint auStack_78 [8];
  uint auStack_58 [10];
  long lVar60;
  
  iVar6 = getRasterFormat(raster);
  if (iVar6 == 0) {
    return (Raster *)0x0;
  }
  raster->pixels = (uint8 *)0x0;
  raster->palette = (uint8 *)0x0;
  uVar11 = raster->width;
  uVar12 = (ulong)uVar11;
  uVar17 = raster->height;
  uVar37 = (ulong)uVar17;
  raster->originalWidth = uVar11;
  raster->originalHeight = uVar17;
  raster->originalPixels = (uint8 *)0x0;
  if (uVar17 == 0 || uVar11 == 0) {
    raster->flags = 0x80;
    raster->stride = 0;
    raster->originalStride = 0;
    return raster;
  }
  pRVar21 = (Raster *)0x0;
  switch(raster->type) {
  case 0:
  case 4:
    lVar56 = (long)nativeRasterOffset;
    uVar24 = raster->format;
    iVar55 = raster->depth;
    lVar52 = (long)iVar55;
    *(undefined1 *)((long)&raster->pixels + lVar56 + 4) = 0;
    *(undefined8 *)((long)&raster->palette + lVar56) = 0;
    *(undefined4 *)((long)&raster->originalPixels + lVar56) = 0;
    if ((raster->flags & 0x80) != 0) {
      return raster;
    }
    if ((int)uVar11 < 2) {
      uVar41 = 0;
    }
    else {
      iVar18 = 1;
      uVar41 = 0;
      do {
        iVar18 = iVar18 * 2;
        uVar41 = uVar41 + 0x4000000;
      } while (iVar18 < (int)uVar11);
    }
    uVar32 = *(uint *)(&DAT_001394ec + lVar52 * 4);
    if ((int)uVar17 < 2) {
      uVar42 = 0;
    }
    else {
      iVar18 = 1;
      uVar42 = 0;
      do {
        iVar18 = iVar18 * 2;
        uVar42 = uVar42 + 0x40000000;
      } while (iVar18 < (int)uVar17);
    }
    uVar33 = uVar24 & 0xf00;
    iVar18 = *(int *)(rasterCreateTexture(rw::Raster*)::pageWidths + lVar52 * 4 + 0x7c);
    uVar43 = uVar32;
    if ((int)uVar32 < (int)uVar11) {
      uVar43 = uVar11;
    }
    uVar8 = uVar43 + 0x3f;
    if (-1 < (int)uVar43) {
      uVar8 = uVar43;
    }
    *(undefined2 *)((long)&raster->privateFlags + lVar56) = (undefined2)defaultMipMapKL;
    uVar43 = uVar24 >> 0xd & 3;
    iVar13 = 0;
    pRVar21 = (Raster *)0x0;
    switch(uVar43) {
    case 0:
      local_180 = CONCAT71((int7)((ulong)((long)&switchD_0012933e::switchdataD_0013943c +
                                         (long)(int)(&switchD_0012933e::switchdataD_0013943c)
                                                    [uVar43]) >> 8),1);
      if (uVar33 == 0x100) {
        local_280 = 10;
        iVar13 = 0;
        iVar40 = 0;
        local_238 = 0;
        iVar49 = 0;
        iVar57 = 0;
        local_1e0 = 0;
        goto LAB_001294c5;
      }
      if (uVar33 == 0x500) {
        iVar40 = 0;
        local_238 = 0;
        iVar49 = 0;
        iVar57 = 0;
        local_1e0 = 0;
        lVar53 = 0;
        local_250 = 0x400000000;
        local_280 = 0;
      }
      else {
        if (uVar33 != 0x600) {
          return (Raster *)0x0;
        }
        local_280 = 1;
        iVar13 = 0;
        iVar40 = 0;
        local_238 = 0;
        iVar49 = 0;
        iVar57 = 0;
        local_1e0 = 0;
        lVar53 = 0;
        local_250 = 0;
      }
      goto LAB_001294cd;
    case 1:
      local_280 = 0x13;
      iVar49 = 0x10;
      iVar57 = 0x10;
      break;
    case 2:
      local_280 = 0x14;
      iVar57 = 8;
      iVar49 = 2;
      break;
    case 3:
      goto switchD_0012924a_caseD_3;
    }
    iVar40 = 0x40;
    if (uVar33 == 0x100) {
      local_1e0 = 0x2000000000000000;
      local_180 = 0;
      lVar53 = 10;
      local_238 = 2;
      iVar13 = 0x40;
    }
    else {
      if (uVar33 != 0x500) {
        return (Raster *)0x0;
      }
      local_1e0 = 0x2000000000000000;
      local_180 = 0x2000000000000001;
      local_238 = 4;
      iVar13 = 0x20;
LAB_001294c5:
      lVar53 = 0;
    }
    local_250 = 0x400000000;
LAB_001294cd:
    local_b0 = &raster->pixels;
    auStack_150[9] = (long)((int)uVar8 >> 6);
    local_1a8 = (undefined1  [16])0x0;
    local_1b8 = (undefined1  [16])0x0;
    local_1c8 = (undefined1  [16])0x0;
    local_198 = 0;
    lVar25 = 0;
    auVar59 = _DAT_00133ef0;
    do {
      local_1c8._8_8_ = 0;
      if (SUB164(auVar59 ^ _DAT_001338e0,4) == DAT_001395f0._4_4_ &&
          SUB164(auVar59 ^ _DAT_001338e0,0) < (int)DAT_001395f0) {
        auStack_150[lVar25 + 1] = 1;
        auStack_150[lVar25 + 2] = 1;
      }
      lVar25 = lVar25 + 2;
      lVar60 = auVar59._8_8_;
      auVar59._0_8_ = auVar59._0_8_ + 2;
      auVar59._8_8_ = lVar60 + 2;
    } while (lVar25 != 8);
    iVar23 = iVar55 * uVar11;
    iVar46 = iVar23 + 7;
    if (-1 < iVar23) {
      iVar46 = iVar23;
    }
    raster->stride = iVar46 >> 3;
    uVar43 = (uint)local_280;
    if ((short)uVar24 < 0) {
      *(undefined4 *)((long)&raster->stride + lVar56) = 0;
      if (maxMipLevels < 1) {
        local_1e8 = 0xfc;
        uVar24 = 0;
      }
      else {
        uVar24 = 0;
        lVar25 = 0;
        uVar8 = 0;
        uVar48 = auStack_150[9];
        uVar19 = uVar12;
        uVar27 = uVar37;
        uVar33 = 0;
        while( true ) {
          uVar51 = (uint)uVar19;
          iVar13 = (int)uVar27;
          if ((7 < (int)uVar17 && 7 < (int)uVar11) && (((int)uVar51 < 8 || (iVar13 < 8)))) break;
          iVar46 = iVar13 * iVar55 * uVar51;
          iVar40 = iVar46 + 7;
          if (-1 < iVar46) {
            iVar40 = iVar46;
          }
          uVar24 = uVar24 + ((iVar40 >> 3) + 0x3fU & 0xffffffc0);
          *(uint *)((long)&raster->stride + lVar56) = uVar24;
          uVar9 = uVar51;
          if ((int)uVar51 < (int)uVar32) {
            uVar9 = uVar32;
          }
          uVar35 = uVar9 + 0x3f;
          if (-1 < (int)uVar9) {
            uVar35 = uVar9;
          }
          uVar50 = (ulong)((int)uVar35 >> 6);
          auStack_150[lVar25 + 1] = uVar50;
          uVar9 = uVar8;
          if (uVar48 != uVar50) {
            bVar22 = (char)lVar25 - 1;
            uVar9 = ((((int)uVar17 >> (bVar22 & 0x1f)) + iVar18 + -1) / iVar18) *
                    ((int)(((int)uVar11 >> (bVar22 & 0x1f)) + (uVar32 - 1)) / (int)uVar32) * 0x800 +
                    uVar33 & 0xfffff800;
          }
          uVar33 = uVar9 + 0x3f >> 8 & 7;
          if (local_280 < 0x15) {
            puVar26 = rasterCreateTexture(rw::Raster*)::blockOffset32_24_8;
            if ((0x80003UL >> local_280 & 1) == 0) {
              if ((0x100004UL >> local_280 & 1) == 0) {
                if (local_280 != 10) goto LAB_00129864;
                puVar26 = rasterCreateTexture(rw::Raster*)::blockOffset16S;
              }
              else {
                puVar26 = rasterCreateTexture(rw::Raster*)::blockOffset16_4;
              }
            }
            uVar33 = *(uint *)(puVar26 + (ulong)uVar33 * 4);
          }
LAB_00129864:
          *(ulong *)(local_1c8 + lVar25 * 8) =
               (ulong)(((int)(uVar9 + 0x3f) >> 6 & 0xffffffe0U) + uVar33);
          lVar25 = lVar25 + 1;
          if ((0xfffffffc < uVar51 - 2) || (0xfffffffc < iVar13 - 2U)) break;
          uVar8 = ((int)(lVar52 * 0x40 * uVar50 >> 3) * iVar13 >> 2) + uVar9 + 0x3f & 0xffffffc0;
          uVar27 = (ulong)(uint)((int)(uVar27 >> 0x1f) + iVar13 >> 1);
          uVar19 = (ulong)(uint)((int)((int)(uVar19 >> 0x1f) + uVar51) >> 1);
          uVar48 = uVar50;
          uVar33 = uVar9;
          if (maxMipLevels <= lVar25) break;
        }
        local_1e8 = (ulong)(byte)((char)lVar25 * '\x04' - 4);
      }
      uVar48 = 8;
      if (uVar43 < 0x32) {
        if ((0x3101008000003U >> local_280 & 1) == 0) {
          if (local_280 == 0x13) {
            local_208 = 0x80;
            local_288 = 0x40;
            uVar48 = 0x10;
            local_290 = 0x10;
          }
          else {
            if (local_280 != 0x14) goto LAB_0012a7f8;
            local_288 = 0x80;
            local_290 = 0x20;
            uVar48 = 0x10;
            local_208 = 0x80;
          }
        }
        else {
          local_208 = 0x40;
          local_288 = 0x20;
          local_290 = 8;
        }
      }
      else {
LAB_0012a7f8:
        local_288 = 0x40;
        local_290 = 0x10;
        local_208 = 0x40;
      }
      uVar19 = uVar37;
      if ((int)uVar11 < (int)uVar17) {
        uVar19 = uVar12;
      }
      uVar33 = 1;
      uVar32 = (uint)local_288;
      if (1 < maxMipLevels && 8 < (uint)uVar19) {
        do {
          uVar33 = uVar33 + 1;
          if ((uint)uVar19 < 0x12) break;
          uVar19 = (ulong)((uint)uVar19 >> 1);
        } while ((int)uVar33 < maxMipLevels);
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_1c8._8_8_;
      local_1c8 = auVar5 << 0x40;
      uVar8 = (uint)local_208;
      local_16c = -uVar8;
      local_260 = (ulong)(((uVar8 + uVar11) - 1 & -uVar8) >> 6);
      auStack_150[1] = local_260;
      local_188 = 0;
      local_f8[0] = (int)(((uVar17 + uVar32) - 1) / local_288);
      local_168[0] = 0;
      local_100 = (ulong)uVar33;
      uVar35 = (uint)local_290;
      uVar51 = (uint)uVar48;
      uVar19 = uVar12;
      uVar9 = uVar17;
      if (1 < uVar33) {
        local_a0 = (ulong)(uVar8 - 1);
        local_a8 = (ulong)(uVar32 - 1);
        iVar18 = uVar35 - 1;
        iVar13 = uVar51 - 1;
        local_b8 = local_208;
        local_178 = (ulong)uVar33 - 1;
        lVar52 = 0;
        local_248 = 0;
        uVar10 = 0;
        uVar47 = 0;
        uVar27 = uVar12;
        uVar50 = uVar37;
        do {
          uVar14 = (uint)uVar27;
          uVar54 = (uint)uVar50;
          uVar15 = uVar14 >> 1;
          uVar19 = (ulong)uVar15;
          uVar9 = uVar54 >> 1;
          uVar36 = local_248;
          if (uVar14 < uVar8) {
            uVar44 = uVar35;
            if (uVar35 < uVar14) {
              uVar44 = uVar14;
            }
            uVar16 = uVar47 + uVar44;
            iVar40 = (int)local_248;
            if (uVar54 < uVar32) {
              iVar46 = local_f8[lVar52];
              local_f8[lVar52 + 1] = iVar46;
              local_168[lVar52 + 1] = local_168[lVar52];
              auStack_150[lVar52 + 2] = auStack_150[lVar52 + 1];
              if ((ulong)uVar16 < auStack_150[lVar52 + 1] << 6) {
                auStack_58[local_248] = uVar44;
                uVar47 = uVar51;
                if (uVar51 < uVar54) {
                  uVar47 = uVar54;
                }
                auStack_78[local_248] = uVar47;
                lVar25 = *(long *)(local_1c8 + lVar52 * 8);
                local_170 = (int)(local_208 / local_290);
                auStack_d8[local_248] = (int)((uVar54 + iVar13) / uVar48) * local_170 + (int)lVar25;
                *(ulong *)(local_1c8 + lVar52 * 8 + 8) = (uVar14 + iVar18) / local_290 + lVar25;
                uVar36 = (ulong)(iVar40 + 1);
                uVar47 = uVar16;
              }
              else {
                uVar14 = uVar51;
                if (uVar51 < uVar54) {
                  uVar14 = uVar54;
                }
                if ((uVar14 + uVar10 < iVar46 * uVar32) && ((int)local_188 == 0)) {
                  *(ulong *)(local_1c8 + lVar52 * 8 + 8) =
                       (ulong)(uint)((int)((iVar13 + uVar54) / uVar48) *
                                    (int)(local_208 / local_290)) +
                       *(long *)(local_1c8 + lVar52 * 8);
                  uVar10 = uVar10 + uVar54;
                  local_188 = (ulong)((int)lVar52 + 1);
                }
                else {
                  uVar36 = (ulong)(iVar40 - 1);
                  uVar14 = uVar35;
                  if (uVar35 < uVar15) {
                    uVar14 = uVar15;
                  }
                  uVar54 = auStack_d8[uVar36];
                  *(ulong *)(local_1c8 + lVar52 * 8 + 8) = (ulong)uVar54;
                  uVar44 = auStack_58[uVar36] - uVar14;
                  if (auStack_58[uVar36] < uVar14 || uVar44 == 0) {
                    uVar14 = uVar51;
                    if (uVar51 < uVar9) {
                      uVar14 = uVar9;
                    }
                    uVar15 = auStack_78[uVar36] - uVar14;
                    if (uVar14 <= auStack_78[uVar36] && uVar15 != 0) {
                      iVar46 = (int)(local_208 / local_290);
                      iVar40 = (int)((iVar13 + uVar9) / uVar48);
LAB_0012a001:
                      auStack_d8[uVar36] = iVar40 * iVar46 + uVar54;
                      auStack_78[uVar36] = uVar15;
                      uVar36 = local_248;
                    }
                  }
                  else {
                    auStack_d8[uVar36] = (int)((iVar18 + uVar15) / local_290) + uVar54;
                    auStack_58[uVar36] = uVar44;
                    uVar36 = local_248;
                  }
                }
              }
            }
            else {
              local_168[lVar52 + 1] = local_168[lVar52];
              local_f8[lVar52 + 1] = local_f8[lVar52];
              auStack_150[lVar52 + 2] = auStack_150[lVar52 + 1];
              if (uVar16 < uVar8) {
                auStack_78[local_248] = uVar54;
                auStack_58[local_248] = uVar44;
                lVar25 = *(long *)(local_1c8 + lVar52 * 8);
                auStack_d8[local_248] =
                     (int)(local_208 / local_290) * ((uVar54 + iVar13) / uVar51) + (int)lVar25;
                *(ulong *)(local_1c8 + lVar52 * 8 + 8) = (uVar14 + iVar18) / local_290 + lVar25;
                uVar36 = (ulong)(iVar40 + 1);
                uVar47 = uVar16;
              }
              else if (iVar40 == 0) {
                uVar10 = uVar10 + uVar54;
                local_248 = 0;
                *(ulong *)(local_1c8 + lVar52 * 8 + 8) =
                     (ulong)(uint)((int)((uVar54 + iVar13) / uVar48) * (int)(local_208 / local_290))
                     + *(long *)(local_1c8 + lVar52 * 8);
                uVar36 = local_248;
              }
              else {
                uVar36 = (ulong)(iVar40 - 1);
                uVar14 = uVar35;
                if (uVar35 < uVar15) {
                  uVar14 = uVar15;
                }
                uVar54 = auStack_d8[uVar36];
                *(ulong *)(local_1c8 + lVar52 * 8 + 8) = (ulong)uVar54;
                uVar44 = auStack_58[uVar36] - uVar14;
                if (auStack_58[uVar36] < uVar14 || uVar44 == 0) {
                  uVar14 = uVar51;
                  if (uVar51 < uVar9) {
                    uVar14 = uVar9;
                  }
                  local_188 = 1;
                  uVar15 = auStack_78[uVar36] - uVar14;
                  if (uVar14 <= auStack_78[uVar36] && uVar15 != 0) {
                    iVar46 = (int)((iVar13 + uVar9) / uVar48);
                    iVar40 = (int)(local_208 / local_290);
                    goto LAB_0012a001;
                  }
                }
                else {
                  auStack_d8[uVar36] = (int)((iVar18 + uVar15) / local_290) + uVar54;
                  auStack_58[uVar36] = uVar44;
                  local_188 = 1;
                  uVar36 = local_248;
                }
              }
            }
          }
          else if (uVar54 < uVar32) {
            local_168[lVar52 + 1] = local_168[lVar52];
            local_f8[lVar52 + 1] = local_f8[lVar52];
            uVar15 = uVar51;
            if (uVar51 < uVar54) {
              uVar15 = uVar54;
            }
            auStack_150[lVar52 + 2] = auStack_150[lVar52 + 1];
            if (uVar15 + uVar10 < uVar32) {
              *(ulong *)(local_1c8 + lVar52 * 8 + 8) =
                   ((ulong)(uint)((int)((uVar54 + iVar13) / uVar48) * (int)(local_208 / local_290))
                    * auStack_150[lVar52 + 1] * 0x40) / local_b8 + *(long *)(local_1c8 + lVar52 * 8)
              ;
              uVar10 = uVar15 + uVar10;
            }
            else {
              *(ulong *)(local_1c8 + lVar52 * 8 + 8) =
                   (uVar14 + iVar18) / local_290 + *(long *)(local_1c8 + lVar52 * 8);
              uVar47 = uVar47 + uVar14;
            }
          }
          else {
            lVar25 = (ulong)(uint)((int)(uVar50 / uVar48) * (int)(uVar27 / local_290)) +
                     *(long *)(local_1c8 + lVar52 * 8);
            *(long *)(local_1c8 + lVar52 * 8 + 8) = lVar25;
            local_168[lVar52 + 1] = (int)lVar25;
            auStack_150[lVar52 + 2] = (ulong)(((int)local_a0 + uVar15 & local_16c) >> 6);
            local_f8[lVar52 + 1] = (int)(((int)local_a8 + uVar9) / local_288);
            uVar10 = 0;
            uVar47 = 0;
          }
          local_248 = uVar36;
          lVar52 = lVar52 + 1;
          uVar27 = uVar19;
          uVar50 = (ulong)uVar9;
        } while (local_178 != lVar52);
      }
      lVar52 = (long)(int)uVar33;
      local_178 = lVar52 + -1;
      uVar27 = auStack_150[lVar52] << 6;
      uVar33 = *(uint *)((long)&local_100 + lVar52 * 4 + 4);
      if ((uVar27 == uVar19) && (uVar33 * uVar32 == uVar9)) {
        if (uVar43 - 0x13 < 2) {
          uVar32 = (int)(uVar9 / uVar48) * (int)((uVar27 & 0xffffffff) / local_290) +
                   local_168[local_178];
        }
        else {
LAB_0012a125:
          uVar32 = 0;
        }
      }
      else if (uVar43 == 0x14) {
        uVar32 = ((int)(uVar27 / local_208) * uVar33 * 0x20 + local_168[local_178]) - 1;
      }
      else {
        if (uVar43 != 0x13) goto LAB_0012a125;
        uVar32 = (((int)(uVar27 / local_208) * uVar33 * 0x20 + local_168[local_178]) -
                 (int)(local_208 / local_290) * (int)((uVar33 * uVar32) / local_208)) - 2;
      }
      uVar19 = 0;
      iVar18 = 0;
      do {
        uVar50 = *(ulong *)(local_1c8 + uVar19 * 8);
        uVar47 = (uint)uVar50;
        uVar8 = (uVar47 - iVar18) * uVar35;
        uVar9 = (int)local_260 << 6;
        uVar36 = auStack_150[uVar19 + 1];
        if ((uVar36 == (local_260 & 0xffffffff)) &&
           (uVar10 = (uVar8 / uVar9) * uVar51, uVar10 < 0x800)) {
          uVar8 = uVar8 % uVar9 | uVar10 * 0x10000;
        }
        else {
          iVar18 = local_168[uVar19];
          uVar9 = (int)uVar36 << 6;
          uVar8 = 0;
          local_260 = uVar36;
        }
        local_98[uVar19] = uVar8;
        uVar8 = (uint)(uVar9 / local_208);
        if (1 < uVar8) {
          uVar36 = (uint)((int)local_260 << 0xb) / local_208;
          uVar2 = uVar9 / local_290;
          uVar3 = local_208 / local_290;
          uVar10 = (uint)uVar36;
          uVar50 = (ulong)(uVar10 - (int)uVar2 & uVar47) / (uVar2 / uVar3) |
                   (uVar36 / uVar2) * (ulong)(uVar47 & (int)uVar2 - (int)uVar3) |
                   (long)(int)~uVar10 + uVar3 & uVar50;
          *(ulong *)(local_1c8 + uVar19 * 8) = uVar50;
        }
        if (uVar43 < 0x2d) {
          puVar26 = blockmap_PSMCT32;
          if ((0x101008080003U >> local_280 & 1) == 0) {
            if ((0x100004UL >> local_280 & 1) == 0) {
              if (local_280 != 10) goto LAB_0012a31d;
              puVar26 = blockmap_PSMCT16S;
            }
            else {
              puVar26 = blockmap_PSMCT16;
            }
          }
          *(ulong *)(local_1c8 + uVar19 * 8) =
               (ulong)(byte)puVar26[(uint)uVar50 & 0x1f] | uVar50 & 0xffffffffffffffe0;
        }
LAB_0012a31d:
        uVar19 = uVar19 + 1;
      } while (local_100 != uVar19);
      if (1 < uVar8) {
        uVar19 = (uint)((int)local_260 << 0xb) / local_208;
        uVar50 = uVar9 / local_290;
        iVar18 = (int)(local_208 / local_290);
        uVar8 = (uint)uVar19;
        uVar32 = (uint)((ulong)(uVar8 - (int)uVar50 & uVar32) / (uVar50 / (local_208 / local_290)))
                 | (int)(uVar19 / uVar50) * ((int)uVar50 - iVar18 & uVar32) |
                   ~uVar8 + iVar18 & uVar32;
      }
      if (uVar43 < 0x2d) {
        if ((0x101008080003U >> local_280 & 1) == 0) {
          if ((0x100004UL >> local_280 & 1) == 0) {
            if (local_280 != 10) goto LAB_0012a437;
            puVar26 = blockmap_PSMCT16S;
          }
          else {
            puVar26 = blockmap_PSMCT16;
          }
        }
        else {
          puVar26 = blockmap_PSMCT32;
        }
        uVar32 = (uint)(byte)puVar26[uVar32 & 0x1f] | uVar32 & 0xffffffe0;
      }
LAB_0012a437:
      iVar18 = ((int)(((uVar27 / local_290) * uVar33 * local_288) / uVar48) + local_168[local_178])
               * 0x40;
      iVar46 = iVar57 * local_238 * iVar49;
      *(int *)(&raster->field_0x24 + lVar56) = iVar46;
      *(ulong *)((long)&raster->format + lVar56) =
           (local_1b8._8_8_ & 0x3fff) << 0x28 |
           auStack_150[4] << 0x36 | (local_1b8._0_8_ & 0x3fff) << 0x14 |
           auStack_150[3] << 0x22 | local_1c8._8_8_ & 0x3fff | auStack_150[2] << 0xe;
      *(ulong *)((long)&raster->height + lVar56) =
           (local_198 & 0x3fff) << 0x28 |
           auStack_150[7] << 0x36 | (local_1a8._8_8_ & 0x3fff) << 0x14 |
           auStack_150[6] << 0x22 | local_1a8._0_8_ & 0x3fff | auStack_150[5] << 0xe;
      *(char *)((long)&raster->privateFlags + lVar56 + 2) = (char)local_1e8;
      *(int *)((long)&raster->pixels + lVar56) = iVar18;
      if (iVar46 == 0) {
        *(undefined4 *)((long)&raster->flags + lVar56) = 0;
        iVar46 = 0;
        uVar32 = 0;
      }
      else {
        *(uint *)((long)&raster->flags + lVar56) = uVar32;
        if (uVar32 << 6 == iVar18) {
          *(int *)((long)&raster->pixels + lVar56) = iVar18 + 0x800;
        }
      }
    }
    else {
      uVar24 = (iVar46 >> 3) * uVar17 + 0xf & 0xfffffff0;
      iVar46 = iVar57 * local_238 * iVar49;
      *(int *)(&raster->field_0x24 + lVar56) = iVar46;
      *(undefined8 *)((long)&raster->format + lVar56) = 0x40000400004000;
      *(undefined8 *)((long)&raster->height + lVar56) = 0x40000400004000;
      *(undefined1 *)((long)&raster->privateFlags + lVar56 + 2) = 0;
      iVar34 = (int)(uVar11 + uVar32 + -1) / (int)uVar32;
      iVar7 = (int)((uVar17 - 1) + iVar18) / iVar18;
      local_1c8 = ZEXT816(0) << 0x40;
      local_98[0] = 0;
      iVar45 = uVar32 * iVar34;
      iVar23 = iVar45 + 0x3f;
      if (-1 < iVar45) {
        iVar23 = iVar45;
      }
      auStack_150[1] = (long)(iVar23 >> 6);
      iVar34 = iVar34 * iVar7;
      uVar32 = iVar34 * 0x800;
      *(uint *)((long)&raster->pixels + lVar56) = uVar32;
      if (iVar46 == 0) {
        *(undefined4 *)((long)&raster->flags + lVar56) = 0;
        iVar46 = 0;
        uVar32 = 0;
      }
      else {
        if ((iVar45 <= (int)uVar11) && (iVar7 * iVar18 <= (int)uVar17)) {
          uVar32 = uVar32 >> 6;
          *(uint *)((long)&raster->flags + lVar56) = uVar32;
          *(int *)((long)&raster->pixels + lVar56) =
               (((iVar13 + iVar49 + -1) / iVar13) * ((iVar40 + iVar57 + -1) / iVar40) + iVar34) *
               0x800;
          local_1e8 = 0;
          goto LAB_0012a599;
        }
        uVar32 = uVar32 - 0x100 >> 6;
        *(uint *)((long)&raster->flags + lVar56) = uVar32;
      }
      local_1e8 = 0;
    }
LAB_0012a599:
    *(ulong *)((long)&raster->platform + lVar56) =
         local_1e0 | local_250 | lVar53 << 0x33 | uVar41 | uVar42 | auStack_150[9] << 0xe |
         (ulong)(uVar43 << 0x14);
    *(uint *)((long)&raster->stride + lVar56) = uVar24;
    if ((noNewStyleRasters == 0) && ((int)(uVar17 * uVar11 * iVar55) < 0x3fff80)) {
      local_1e8 = local_1e8 >> 2;
      uVar11 = (int)local_1e8 + 1;
      *(undefined1 *)((long)&raster->pixels + lVar56 + 4) = 1;
      if (uVar43 == 0x13) {
        uVar17 = local_98[local_1e8];
        *(undefined1 *)((long)&raster->pixels + lVar56 + 4) = 3;
        if ((((char)local_180 == '\0') || (auStack_150[local_1e8 + 1] != 2)) ||
           (uVar17 = (((uVar17 >> 4 & 0x7f) + (uVar17 >> 0x11 & 0x3f8)) -
                     ((uint)(byte)blockmaprev_PSMCT32
                                  [(uint)*(undefined8 *)(local_1c8 + local_1e8 * 8) & 0x1f] |
                     (uint)*(undefined8 *)(local_1c8 + local_1e8 * 8) & 0xffffffe0)) +
                     ((uint)(byte)blockmaprev_PSMCT32[uVar32 & 0x1f] | uVar32 & 0xffffffe0),
           0x7ff < uVar17)) {
          uVar41 = 0;
        }
        else {
          uVar41 = (ulong)((uVar17 & 0x7f8) * 0x10000 + (uVar17 & 7) * 8);
        }
        uVar24 = 4;
        bVar58 = false;
        iVar13 = 0x10;
      }
      else {
        bVar58 = uVar43 == 0x14;
        bVar1 = 0x31000 < version;
        if (bVar1 && bVar58) {
          *(undefined1 *)((long)&raster->pixels + lVar56 + 4) = 5;
          iVar18 = 8;
          uVar17 = 0x14;
          bVar30 = true;
        }
        else {
          iVar18 = 2;
          uVar24 = 1;
          uVar17 = uVar43;
          bVar30 = bVar58;
          if (uVar43 < 0x1b) {
            if (uVar43 < 10) {
              if (uVar43 == 0) goto switchD_0012a868_caseD_30;
              if (uVar43 != 1) {
                if (uVar43 == 2) goto switchD_0012a868_caseD_32;
                goto switchD_0012a868_caseD_2d;
              }
            }
            else if (1 < uVar43 - 0x13) {
              if (uVar43 == 10) goto switchD_0012a868_caseD_32;
              goto switchD_0012a868_caseD_2d;
            }
          }
          else {
            if (0x2b < uVar43) {
              switch(uVar43) {
              case 0x2c:
              case 0x31:
                goto switchD_0012a868_caseD_2c;
              case 0x30:
                goto switchD_0012a868_caseD_30;
              case 0x32:
switchD_0012a868_caseD_32:
                iVar18 = 4;
                goto switchD_0012a868_caseD_30;
              default:
                if (uVar43 == 0x3a) goto switchD_0012a868_caseD_32;
              case 0x2d:
              case 0x2e:
              case 0x2f:
switchD_0012a868_caseD_2d:
                uVar41 = 0;
                iVar13 = iVar49;
              }
              goto LAB_0012a8da;
            }
            if ((uVar43 != 0x1b) && (uVar43 != 0x24)) goto switchD_0012a868_caseD_2d;
          }
switchD_0012a868_caseD_2c:
          iVar18 = 8;
        }
switchD_0012a868_caseD_30:
        bVar4 = uVar17 == 0x14 && (bVar1 && bVar58);
        iVar13 = 0x20;
        if (uVar17 != 0x14 || (!bVar1 || !bVar58)) {
          iVar13 = iVar18;
        }
        uVar24 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
        uVar41 = 0;
        bVar58 = bVar30;
      }
LAB_0012a8da:
      iVar18 = uVar11 * 0x50;
      uVar17 = uVar11;
      do {
        iVar23 = (int)uVar12;
        iVar40 = iVar13;
        if (iVar13 < iVar23) {
          iVar40 = iVar23;
        }
        uVar33 = (uint)uVar37;
        uVar32 = uVar24;
        if ((int)uVar24 < (int)uVar33) {
          uVar32 = uVar33;
        }
        iVar40 = uVar32 * iVar55 * iVar40;
        iVar7 = iVar40 + 7;
        if (-1 < iVar40) {
          iVar7 = iVar40;
        }
        iVar18 = iVar18 + ((iVar7 >> 3) + 0xfU & 0xfffffff0);
        uVar37 = (ulong)(uint)((int)((int)(uVar37 >> 0x1f) + uVar33) >> 1);
        uVar12 = (ulong)(uint)((int)(uVar12 >> 0x1f) + iVar23 >> 1);
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
      *(int *)((long)&raster->stride + lVar56) = iVar18;
      iVar55 = 0;
      if (iVar46 == 0) {
        iVar40 = 0;
      }
      else {
        iVar40 = 3;
        if (version < 0x31001) {
          iVar40 = iVar49;
        }
        if (iVar49 != 2) {
          iVar40 = iVar49;
        }
        iVar49 = iVar40;
        iVar40 = local_238 * iVar57 * iVar49 + 0x50;
        *(int *)(&raster->field_0x24 + lVar56) = iVar40;
      }
      uVar12 = 0;
      uVar37 = 0x10;
      do {
        uVar42 = (ulong)((int)uVar37 + 0x40);
        if (local_98[uVar12] != 0) {
          uVar42 = uVar37;
        }
        iVar55 = iVar55 + (uint)(local_98[uVar12] == 0);
        uVar12 = uVar12 + 1;
        uVar37 = uVar42;
      } while (uVar11 != uVar12);
      uVar37 = (ulong)((int)uVar42 + 0x40);
      if ((iVar40 == 0) || (uVar42 = uVar37, uVar41 != 0)) {
        uVar37 = uVar42;
        uVar17 = iVar40 + iVar18 + 0x3fU & 0xffffffc0;
      }
      else {
        uVar17 = (iVar40 + 0x3fU & 0xffffffc0) + (iVar18 + 0x7fU & 0xffffff80);
      }
      iVar55 = iVar55 + (uint)(iVar40 != 0);
      uVar17 = (int)uVar37 + uVar17 + 0x70;
      *(uint *)((long)&raster->originalPixels + lVar56) = uVar17;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2raster.cpp line: 89"
      ;
      lVar52 = (*Engine::memfuncs)((ulong)uVar17 + 0x48,0x30a04);
      if (lVar52 == 0) {
        plVar20 = (long *)0x0;
      }
      else {
        plVar20 = (long *)(lVar52 + 0x48U & 0xffffffffffffffc0);
        plVar20[-1] = lVar52;
      }
      *(long **)((long)&raster->palette + lVar56) = plVar20;
      *(int *)(plVar20 + 1) = iVar55;
      *(int *)((long)plVar20 + 0xc) = iVar55;
      puVar28 = (undefined8 *)((long)plVar20 + uVar37 + 0x7f & 0xffffffffffffff80);
      *plVar20 = (long)puVar28;
      raster->pixels = (uint8 *)plVar20;
      if (*(int *)(&raster->field_0x24 + lVar56) != 0) {
        raster->palette =
             (uint8 *)((long)puVar28 +
                      (ulong)(*(int *)((long)&raster->stride + lVar56) + 0x7fU & 0xffffff80) + 0x50)
        ;
      }
      plVar38 = plVar20 + 2;
      iVar6 = raster->width;
      uVar17 = raster->height;
      bVar22 = *(byte *)((long)&raster->pixels + lVar56 + 4);
      bVar39 = (byte)((bVar22 & 2) >> 1) & local_280 == 0x13;
      bVar31 = bVar58 & (byte)((bVar22 & 4) >> 2);
      uVar37 = 0;
      do {
        iVar55 = iVar6;
        if (iVar6 <= iVar13) {
          iVar55 = iVar13;
        }
        uVar32 = uVar17;
        if ((int)uVar17 <= (int)uVar24) {
          uVar32 = uVar24;
        }
        *puVar28 = 0x1000000000000003;
        puVar28[1] = 0xe;
        *(undefined4 *)(puVar28 + 2) = 0;
        uVar33 = local_98[uVar37];
        if (bVar39 == 0 && bVar31 == 0) {
          *(uint *)((long)puVar28 + 0x14) = uVar33;
          puVar28[3] = 0x51;
LAB_0012ab4f:
          if (bVar31 != 0) goto LAB_0012ab54;
          *(int *)(puVar28 + 4) = iVar55;
          *(uint *)((long)puVar28 + 0x24) = uVar32;
        }
        else {
          *(uint *)((long)puVar28 + 0x14) = uVar33 >> 1 & 0x7fff7fff;
          puVar28[3] = 0x51;
          if (bVar39 == 0) goto LAB_0012ab4f;
LAB_0012ab54:
          *(int *)(puVar28 + 4) = iVar55 / 2;
          *(uint *)((long)puVar28 + 0x24) = uVar32 >> 1;
          uVar33 = local_98[uVar37];
        }
        *(undefined1 (*) [16])(puVar28 + 5) = ZEXT416(0x52);
        puVar28[7] = 0x53;
        iVar18 = iVar55 * uVar32 * raster->depth;
        iVar55 = iVar18 + 7;
        if (-1 < iVar18) {
          iVar55 = iVar18;
        }
        uVar32 = (iVar55 >> 3) + 0xf >> 4;
        *(uint *)(puVar28 + 8) = uVar32 & 0x7fff;
        *(undefined8 *)((long)puVar28 + 0x44) = 0x8000000;
        *(undefined4 *)((long)puVar28 + 0x4c) = 0;
        if (uVar33 == 0) {
          *plVar38 = 0x10000002;
          plVar38[1] = 0x5000000200000000;
          plVar38[2] = 0x1000000000000001;
          plVar38[3] = 0xe;
          uVar33 = (uint)auStack_150[uVar37 + 1];
          if (bVar39 == 0) {
            if (bVar31 != 0) {
              uVar33 = (uVar33 & 0x1fbfe) << 0xf | 0x2000000;
              goto LAB_0012ac2e;
            }
            *(uint *)(plVar38 + 4) = uVar33 << 0x10 | uVar43 << 0x18;
            *(uint *)((long)plVar38 + 0x24) =
                 *(uint *)(local_1c8 + uVar37 * 8) | uVar43 << 0x18 | uVar33 << 0x10;
          }
          else {
            uVar33 = (uVar33 & 0xfffffffe) << 0xf;
LAB_0012ac2e:
            *(uint *)(plVar38 + 4) = uVar33;
            *(uint *)((long)plVar38 + 0x24) = uVar33 | *(uint *)(local_1c8 + uVar37 * 8);
          }
          plVar38[5] = 0x50;
          *(uint *)(plVar38 + 6) = uVar32 + 5 | 0x30000000;
          *(int *)((long)plVar38 + 0x34) = (int)puVar28;
          *(undefined4 *)(plVar38 + 7) = 0;
          *(uint *)((long)plVar38 + 0x3c) = uVar32 + 5 | 0x50000000;
          plVar38 = plVar38 + 8;
        }
        else {
          *(uint *)(plVar38 + -2) = *(ushort *)(plVar38 + -2) + uVar32 + 5 | 0x30000000;
          *(uint *)((long)plVar38 + -4) = *(ushort *)((long)plVar38 + -4) + uVar32 + 5 | 0x50000000;
        }
        puVar28 = (undefined8 *)((long)puVar28 + (ulong)(uVar32 << 2) * 4 + 0x50);
        iVar6 = iVar6 / 2;
        uVar17 = (int)uVar17 / 2;
        uVar37 = uVar37 + 1;
      } while (uVar11 != uVar37);
      if (*(int *)(&raster->field_0x24 + lVar56) != 0) {
        if (uVar41 == 0) {
          puVar29 = raster->palette;
        }
        else {
          puVar29 = (uint8 *)(puVar28 + 10);
          raster->palette = puVar29;
        }
        puVar29[-0x50] = '\x03';
        puVar29[-0x4f] = '\0';
        puVar29[-0x4e] = '\0';
        puVar29[-0x4d] = '\0';
        puVar29[-0x4c] = '\0';
        puVar29[-0x4b] = '\0';
        puVar29[-0x4a] = '\0';
        puVar29[-0x49] = '\x10';
        puVar29[-0x48] = '\x0e';
        puVar29[-0x47] = '\0';
        puVar29[-0x46] = '\0';
        puVar29[-0x45] = '\0';
        puVar29[-0x44] = '\0';
        puVar29[-0x43] = '\0';
        puVar29[-0x42] = '\0';
        puVar29[-0x41] = '\0';
        *(ulong *)(puVar29 + -0x40) = uVar41;
        puVar29[-0x38] = 'Q';
        puVar29[-0x37] = '\0';
        puVar29[-0x36] = '\0';
        puVar29[-0x35] = '\0';
        puVar29[-0x34] = '\0';
        puVar29[-0x33] = '\0';
        puVar29[-0x32] = '\0';
        puVar29[-0x31] = '\0';
        *(int *)(puVar29 + -0x30) = iVar57;
        *(int *)(puVar29 + -0x2c) = iVar49;
        *(undefined1 (*) [16])(puVar29 + -0x28) = ZEXT416(0x52);
        puVar29[-0x18] = 'S';
        puVar29[-0x17] = '\0';
        puVar29[-0x16] = '\0';
        puVar29[-0x15] = '\0';
        puVar29[-0x14] = '\0';
        puVar29[-0x13] = '\0';
        puVar29[-0x12] = '\0';
        puVar29[-0x11] = '\0';
        uVar11 = *(int *)(&raster->field_0x24 + lVar56) - 0x41U >> 4;
        *(uint *)(puVar29 + -0x10) = uVar11 & 0x7fff;
        puVar29[-0xc] = '\0';
        puVar29[-0xb] = '\0';
        puVar29[-10] = '\0';
        puVar29[-9] = '\b';
        puVar29[-8] = '\0';
        puVar29[-7] = '\0';
        puVar29[-6] = '\0';
        puVar29[-5] = '\0';
        puVar29[-4] = '\0';
        puVar29[-3] = '\0';
        puVar29[-2] = '\0';
        puVar29[-1] = '\0';
        *plVar38 = 0x10000002;
        plVar38[1] = 0x5000000200000000;
        plVar38[2] = 0x1000000000000001;
        plVar38[3] = 0xe;
        if (uVar41 == 0) {
          uVar17 = (int)lVar53 << 0x18 | 0x10000;
          *(uint *)(plVar38 + 4) = uVar17;
          *(uint *)((long)plVar38 + 0x24) = uVar17 | *(uint *)((long)&raster->flags + lVar56);
          plVar38[5] = 0x50;
        }
        else {
          plVar38[4] = plVar38[-4];
          plVar38[5] = plVar38[-3];
          *(uint *)(plVar38 + -4) = *(ushort *)(plVar38 + -4) + uVar11 + 5 | 0x30000000;
          *(uint *)((long)plVar38 + -0x14) =
               *(ushort *)((long)plVar38 + -0x14) + uVar11 + 5 | 0x50000000;
          *(int *)(plVar20 + 1) = (int)plVar20[1] + -1;
        }
        *(uint *)(plVar38 + 6) = uVar11 + 5 | 0x30000000;
        *(int *)((long)plVar38 + 0x34) = (int)puVar29 + -0x50;
        *(undefined4 *)(plVar38 + 7) = 0;
        *(uint *)((long)plVar38 + 0x3c) = uVar11 + 5 | 0x50000000;
      }
    }
    else {
      *(uint *)((long)&raster->originalPixels + lVar56) = uVar24 + iVar46;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2raster.cpp line: 89"
      ;
      lVar52 = (*Engine::memfuncs)((ulong)(uVar24 + iVar46) + 0x48,0x30a04);
      if (lVar52 == 0) {
        plVar20 = (long *)0x0;
      }
      else {
        plVar20 = (long *)(lVar52 + 0x48U & 0xffffffffffffffc0);
        plVar20[-1] = lVar52;
      }
      *(long **)((long)&raster->palette + lVar56) = plVar20;
      raster->pixels = (uint8 *)plVar20;
      if (*(int *)(&raster->field_0x24 + lVar56) != 0) {
        raster->palette =
             (uint8 *)((ulong)*(uint *)((long)&raster->stride + lVar56) + (long)plVar20);
      }
      bVar22 = *(byte *)((long)&raster->pixels + lVar56 + 4);
      if (raster->depth == 8) {
        bVar22 = bVar22 | 2;
        *(byte *)((long)&raster->pixels + lVar56 + 4) = bVar22;
      }
    }
    raster->originalPixels = (uint8 *)plVar20;
    raster->originalStride = raster->stride;
    pRVar21 = raster;
    if ((bVar22 & 1) != 0) {
      *local_b0 = (uint8 *)(*plVar20 + 0x50);
    }
    break;
  case 1:
  case 2:
    raster->flags = 0x80;
    pRVar21 = raster;
  }
switchD_0012924a_caseD_3:
  return pRVar21;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	if(!getRasterFormat(raster))
		return nil;

	// init raster
	raster->pixels = nil;
	raster->palette = nil;
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalPixels = raster->pixels;
	if(raster->width == 0 || raster->height == 0){
		raster->flags = Raster::DONTALLOCATE;
		raster->stride = 0;
		raster->originalStride = 0;
		return raster;
	}

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
		return rasterCreateTexture(raster);
	case Raster::ZBUFFER:
		// TODO. only RW_PS2
		// get info from video mode
		raster->flags = Raster::DONTALLOCATE;
		return raster;
	case Raster::CAMERA:
		// TODO. only RW_PS2
		// get info from video mode
		raster->flags = Raster::DONTALLOCATE;
		return raster;
	case Raster::CAMERATEXTURE:
		// TODO. only RW_PS2
		// check width/height and fall through to texture
		return nil;
	}
	return nil;
}